

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

void Aig_SupportSize_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int *pCounter)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int *pCounter_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if ((iVar1 == 0) && (iVar1 = Aig_ObjIsBuf(pObj), iVar1 == 0)) {
        __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                      ,0x2f3,"void Aig_SupportSize_rec(Aig_Man_t *, Aig_Obj_t *, int *)");
      }
      pAVar2 = Aig_ObjFanin0(pObj);
      Aig_SupportSize_rec(p,pAVar2,pCounter);
      pAVar2 = Aig_ObjFanin1(pObj);
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        pAVar2 = Aig_ObjFanin1(pObj);
        Aig_SupportSize_rec(p,pAVar2,pCounter);
      }
    }
    else {
      *pCounter = *pCounter + 1;
    }
  }
  return;
}

Assistant:

void Aig_SupportSize_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int * pCounter )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        (*pCounter)++;
        return;
    }
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_SupportSize_rec( p, Aig_ObjFanin0(pObj), pCounter );
    if ( Aig_ObjFanin1(pObj) )
        Aig_SupportSize_rec( p, Aig_ObjFanin1(pObj), pCounter );
}